

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool __thiscall
cmInstallCommand::HandleFilesMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  cmInstallCommand *pcVar3;
  bool bVar4;
  PolicyStatus PVar5;
  ostream *poVar6;
  string *psVar7;
  const_iterator cVar8;
  undefined4 extraout_var;
  size_t sVar9;
  cmInstallFilesGenerator *g;
  cmGlobalGenerator *this_00;
  char *pcVar10;
  pointer pbVar11;
  static_string_view name;
  undefined1 auVar12 [12];
  string destination;
  string type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absFiles;
  ostringstream e;
  cmInstallCommandArguments ica;
  string local_418;
  undefined4 local_3f4;
  MessageType local_3f0;
  int local_3ec;
  string local_3e8;
  cmInstallCommand *local_3c8;
  uint local_3bc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  undefined8 local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  string *local_378;
  cmGlobalGenerator *local_370;
  string local_368;
  string local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  undefined1 local_308 [376];
  cmInstallCommandArguments local_190;
  
  local_3ec = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
  pcVar1 = (this->DefaultComponentName)._M_dataplus._M_p;
  local_3c8 = this;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,pcVar1,pcVar1 + (this->DefaultComponentName)._M_string_length);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_190,&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_3b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar10 = "FILES";
  if (local_3ec == 0) {
    pcVar10 = "PROGRAMS";
  }
  name.super_string_view._M_len = (ulong)(local_3ec == 0) * 3 + 5;
  name.super_string_view._M_str = pcVar10;
  cmArgumentParser<void>::
  Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_190.super_cmArgumentParser<void>,name,&local_3b8);
  pcVar3 = local_3c8;
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_190.super_cmArgumentParser<void>,args,&local_398,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0);
  if (local_398.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_398.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_308,(pbVar11->_M_dataplus)._M_p,pbVar11->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," given unknown argument \"",0x19);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,((local_398.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (local_398.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&pcVar3->super_cmCommand,&local_3e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x70));
    bVar4 = false;
    goto LAB_002d548b;
  }
  psVar7 = cmInstallCommandArguments::GetType_abi_cxx11_(&local_190);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  pcVar1 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e8,pcVar1,pcVar1 + psVar7->_M_string_length);
  if ((local_3e8._M_string_length == 0) ||
     (cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&allowedTypes_abi_cxx11_._M_t,&local_3e8),
     (_Rb_tree_header *)cVar8._M_node != &allowedTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
     )) {
    if (local_3b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_3b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar4 = true;
    }
    else {
      psVar7 = cmInstallCommandArguments::GetRename_abi_cxx11_(&local_190);
      if ((psVar7->_M_string_length != 0) &&
         (0x20 < (ulong)((long)local_3b8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_3b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
        pbVar11 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_308,(pbVar11->_M_dataplus)._M_p,
                            pbVar11->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," given RENAME option with more than one file.",0x2d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&pcVar3->super_cmCommand,&local_418);
        goto LAB_002d5430;
      }
      local_328.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_328.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_328.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = MakeFilesFullPath(pcVar3,(((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p,&local_3b8,&local_328);
      if (bVar4) {
        PVar5 = cmMakefile::GetPolicyStatus((pcVar3->super_cmCommand).Makefile,CMP0062,false);
        local_3a0 = CONCAT44(extraout_var,PVar5);
        local_370 = cmMakefile::GetGlobalGenerator((pcVar3->super_cmCommand).Makefile);
        local_378 = local_3b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_3b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_3b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_3bc = (int)local_3a0 - 2;
          pbVar11 = local_3b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            bVar4 = cmGlobalGenerator::IsExportedTargetsFile(local_370,pbVar11);
            if (bVar4) {
              auVar12 = std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
              if (local_3bc < 3) {
                local_3f0 = FATAL_ERROR;
                local_3f4 = (undefined4)CONCAT71(auVar12._1_7_,1);
                bVar4 = false;
                pcVar10 = "may";
              }
              else {
                if ((int)local_3a0 == 1) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_
                            (&local_418,(cmPolicies *)0x3e,auVar12._8_4_);
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_308,local_418._M_dataplus._M_p,
                                      local_418._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,
                                    local_418.field_2._M_allocated_capacity + 1);
                  }
                  bVar4 = false;
                  pcVar10 = "should";
                }
                else {
                  pcVar10 = (char *)0x0;
                  bVar4 = true;
                }
                local_3f4 = 0;
                local_3f0 = AUTHOR_WARNING;
              }
              if (!bVar4) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_308,"The file\n  ",0xb);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_308,(pbVar11->_M_dataplus)._M_p,
                                    pbVar11->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6,"\nwas generated by the export() command.  It ",0x2c);
                sVar9 = strlen(pcVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,sVar9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6,
                           " not be installed with the install() command.  Use the install(EXPORT) mechanism instead.  See the cmake-packages(7) manual for more.\n"
                           ,0x86);
                pcVar2 = (local_3c8->super_cmCommand).Makefile;
                std::__cxx11::stringbuf::str();
                cmMakefile::IssueMessage(pcVar2,local_3f0,&local_418);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418._M_dataplus._M_p != &local_418.field_2) {
                  operator_delete(local_418._M_dataplus._M_p,
                                  local_418.field_2._M_allocated_capacity + 1);
                }
                if ((char)local_3f4 != '\0') goto LAB_002d5376;
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
              std::ios_base::~ios_base((ios_base *)(local_308 + 0x70));
            }
            pbVar11 = pbVar11 + 1;
          } while (pbVar11 != local_378);
        }
        bVar4 = cmInstallCommandArguments::Finalize(&local_190);
        pcVar3 = local_3c8;
        if (!bVar4) goto LAB_002d5397;
        if ((local_3e8._M_string_length != 0) &&
           (psVar7 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_190),
           psVar7->_M_string_length != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          pbVar11 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_308,(pbVar11->_M_dataplus)._M_p,
                              pbVar11->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," given both TYPE and DESTINATION arguments. You may only specify one.",
                     0x45);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&pcVar3->super_cmCommand,&local_418);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
          }
LAB_002d5376:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
          std::ios_base::~ios_base((ios_base *)(local_308 + 0x70));
          goto LAB_002d5397;
        }
        GetDestinationForType(&local_418,pcVar3,&local_190,&local_3e8);
        bVar4 = local_418._M_string_length != 0;
        if (local_418._M_string_length == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
          pbVar11 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_308,(pbVar11->_M_dataplus)._M_p,
                              pbVar11->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," given no DESTINATION!",0x16);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&pcVar3->super_cmCommand,&local_368);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
          std::ios_base::~ios_base((ios_base *)(local_308 + 0x70));
        }
        else {
          pcVar2 = (pcVar3->super_cmCommand).Makefile;
          g = CreateInstallFilesGenerator(pcVar2,&local_328,&local_190,local_3ec == 0,&local_418);
          cmMakefile::AddInstallGenerator(pcVar2,&g->super_cmInstallGenerator);
          this_00 = cmMakefile::GetGlobalGenerator((pcVar3->super_cmCommand).Makefile);
          psVar7 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_190);
          cmGlobalGenerator::AddInstallComponent(this_00,psVar7);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
      }
      else {
LAB_002d5397:
        bVar4 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_328);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_308,(pbVar11->_M_dataplus)._M_p,pbVar11->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," given non-type \"",0x11);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" with TYPE argument.",0x15);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&pcVar3->super_cmCommand,&local_418);
LAB_002d5430:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
    std::ios_base::~ios_base((ios_base *)(local_308 + 0x70));
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
LAB_002d548b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_398);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3b8);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_190);
  return bVar4;
}

Assistant:

bool cmInstallCommand::HandleFilesMode(std::vector<std::string> const& args)
{
  // This is the FILES mode.
  bool programs = (args[0] == "PROGRAMS");
  cmInstallCommandArguments ica(this->DefaultComponentName);
  std::vector<std::string> files;
  ica.Bind(programs ? "PROGRAMS"_s : "FILES"_s, files);
  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
  }

  std::string type = ica.GetType();
  if (!type.empty() && allowedTypes.count(type) == 0) {
    std::ostringstream e;
    e << args[0] << " given non-type \"" << type << "\" with TYPE argument.";
    this->SetError(e.str());
    return false;
  }

  const std::vector<std::string>& filesVector = files;

  // Check if there is something to do.
  if (filesVector.empty()) {
    return true;
  }

  if (!ica.GetRename().empty() && filesVector.size() > 1) {
    // The rename option works only with one file.
    std::ostringstream e;
    e << args[0] << " given RENAME option with more than one file.";
    this->SetError(e.str());
    return false;
  }

  std::vector<std::string> absFiles;
  if (!this->MakeFilesFullPath(args[0].c_str(), filesVector, absFiles)) {
    return false;
  }

  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0062);

  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
  for (std::string const& file : filesVector) {
    if (gg->IsExportedTargetsFile(file)) {
      const char* modal = nullptr;
      std::ostringstream e;
      MessageType messageType = MessageType::AUTHOR_WARNING;

      switch (status) {
        case cmPolicies::WARN:
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0062) << "\n";
          modal = "should";
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          modal = "may";
          messageType = MessageType::FATAL_ERROR;
      }
      if (modal) {
        e << "The file\n  " << file
          << "\nwas generated by the export() "
             "command.  It "
          << modal
          << " not be installed with the "
             "install() command.  Use the install(EXPORT) mechanism "
             "instead.  See the cmake-packages(7) manual for more.\n";
        this->Makefile->IssueMessage(messageType, e.str());
        if (messageType == MessageType::FATAL_ERROR) {
          return false;
        }
      }
    }
  }

  if (!ica.Finalize()) {
    return false;
  }

  if (!type.empty() && !ica.GetDestination().empty()) {
    std::ostringstream e;
    e << args[0]
      << " given both TYPE and DESTINATION arguments. You may only specify "
         "one.";
    this->SetError(e.str());
    return false;
  }

  std::string destination = this->GetDestinationForType(&ica, type);
  if (destination.empty()) {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
  }

  // Create the files install generator.
  this->Makefile->AddInstallGenerator(CreateInstallFilesGenerator(
    this->Makefile, absFiles, ica, programs, destination));

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()->AddInstallComponent(
    ica.GetComponent());

  return true;
}